

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

Data * __thiscall Bracket::eval(Bracket *this,Runtime *runtime)

{
  Atom *pAVar1;
  bool bVar2;
  int iVar3;
  tms *__buffer;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Self *p_Var4;
  undefined4 extraout_var_01;
  ulong uVar5;
  size_type sVar6;
  reference ppDVar7;
  reference ppAVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Data_*,_std::allocator<Data_*>_> *pvVar10;
  long local_d8;
  Bool *judge;
  Data *temp_1;
  iterator cursor;
  int i;
  vector<Data_*,_std::allocator<Data_*>_> *temp;
  _List_iterator<Atom_*> local_40;
  _List_iterator<Atom_*> local_38;
  _List_iterator<Atom_*> local_30;
  _List_iterator<Atom_*> local_28;
  Data *local_20;
  Data *result;
  Runtime *runtime_local;
  Bracket *this_local;
  Data *pDVar9;
  
  result = (Data *)runtime;
  runtime_local = (Runtime *)this;
  Runtime::pushVarEnv(runtime);
  bVar2 = std::operator==(&this->func,"+");
  if (bVar2) {
    pvVar10 = genParaData(this,(Runtime *)result);
    local_20 = Data::plus(pvVar10);
  }
  else {
    bVar2 = std::operator==(&this->func,"-");
    if (bVar2) {
      pvVar10 = genParaData(this,(Runtime *)result);
      local_20 = Data::minus(pvVar10);
    }
    else {
      bVar2 = std::operator==(&this->func,"*");
      if (bVar2) {
        __buffer = (tms *)genParaData(this,(Runtime *)result);
        local_20 = (Data *)Data::times(__buffer);
      }
      else {
        bVar2 = std::operator==(&this->func,">");
        if (bVar2) {
          pvVar10 = genParaData(this,(Runtime *)result);
          local_20 = Data::bigger(pvVar10);
        }
        else {
          bVar2 = std::operator==(&this->func,"<");
          if (bVar2) {
            pvVar10 = genParaData(this,(Runtime *)result);
            local_20 = Data::smaller(pvVar10);
          }
          else {
            bVar2 = std::operator==(&this->func,"/");
            if (bVar2) {
              pvVar10 = genParaData(this,(Runtime *)result);
              local_20 = Data::divide(pvVar10);
            }
            else {
              bVar2 = std::operator==(&this->func,"%");
              if (bVar2) {
                pvVar10 = genParaData(this,(Runtime *)result);
                local_20 = Data::mod(pvVar10);
              }
              else {
                bVar2 = std::operator==(&this->func,"=");
                if (bVar2) {
                  pvVar10 = genParaData(this,(Runtime *)result);
                  local_20 = Data::equal(pvVar10);
                }
                else {
                  bVar2 = std::operator==(&this->func,"set");
                  pDVar9 = result;
                  if (bVar2) {
                    local_28._M_node =
                         (_List_node_base *)
                         std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
                    ppAVar8 = std::_List_iterator<Atom_*>::operator*(&local_28);
                    pAVar1 = *ppAVar8;
                    local_30._M_node =
                         (_List_node_base *)
                         std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
                    p_Var4 = std::_List_iterator<Atom_*>::operator++(&local_30);
                    ppAVar8 = std::_List_iterator<Atom_*>::operator*(p_Var4);
                    iVar3 = (*(*ppAVar8)->_vptr_Atom[3])(*ppAVar8,result);
                    Runtime::setVar((Runtime *)pDVar9,(string *)(pAVar1 + 1),
                                    (Data *)CONCAT44(extraout_var,iVar3));
                    local_20 = Data::trueData;
                  }
                  else {
                    bVar2 = std::operator==(&this->func,"echo");
                    if (bVar2) {
                      local_38._M_node =
                           (_List_node_base *)
                           std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
                      ppAVar8 = std::_List_iterator<Atom_*>::operator*(&local_38);
                      iVar3 = (*(*ppAVar8)->_vptr_Atom[3])(*ppAVar8,result);
                      local_20 = (Data *)CONCAT44(extraout_var_00,iVar3);
                    }
                    else {
                      bVar2 = std::operator==(&this->func,"assign");
                      pDVar9 = result;
                      if (bVar2) {
                        local_40._M_node =
                             (_List_node_base *)
                             std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para)
                        ;
                        ppAVar8 = std::_List_iterator<Atom_*>::operator*(&local_40);
                        pAVar1 = *ppAVar8;
                        temp = (vector<Data_*,_std::allocator<Data_*>_> *)
                               std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin
                                         (&this->para);
                        p_Var4 = std::_List_iterator<Atom_*>::operator++
                                           ((_List_iterator<Atom_*> *)&temp);
                        ppAVar8 = std::_List_iterator<Atom_*>::operator*(p_Var4);
                        iVar3 = (*(*ppAVar8)->_vptr_Atom[3])(*ppAVar8,result);
                        Runtime::assignVar((Runtime *)pDVar9,(string *)(pAVar1 + 1),
                                           (Data *)CONCAT44(extraout_var_01,iVar3));
                        local_20 = Data::trueData;
                      }
                      else {
                        bVar2 = std::operator==(&this->func,"begin");
                        if (bVar2) {
                          pvVar10 = genParaData(this,(Runtime *)result);
                          for (cursor._M_node._4_4_ = 0; uVar5 = (ulong)cursor._M_node._4_4_,
                              sVar6 = std::vector<Data_*,_std::allocator<Data_*>_>::size(pvVar10),
                              uVar5 < sVar6 - 1; cursor._M_node._4_4_ = cursor._M_node._4_4_ + 1) {
                            ppDVar7 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[]
                                                (pvVar10,(long)cursor._M_node._4_4_);
                            Data::check(*ppDVar7);
                          }
                          sVar6 = std::vector<Data_*,_std::allocator<Data_*>_>::size(pvVar10);
                          ppDVar7 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[]
                                              (pvVar10,sVar6 - 1);
                          local_20 = *ppDVar7;
                          if (pvVar10 != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
                            std::vector<Data_*,_std::allocator<Data_*>_>::~vector(pvVar10);
                            operator_delete(pvVar10);
                          }
                        }
                        else {
                          bVar2 = std::operator==(&this->func,"print");
                          if (bVar2) {
                            pvVar10 = genParaData(this,(Runtime *)result);
                            local_20 = Data::print(pvVar10);
                          }
                          else {
                            bVar2 = std::operator==(&this->func,"display");
                            if (bVar2) {
                              pvVar10 = genParaData(this,(Runtime *)result);
                              local_20 = Data::display(pvVar10);
                            }
                            else {
                              bVar2 = std::operator==(&this->func,"if");
                              if (bVar2) {
                                temp_1 = (Data *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>
                                                 ::begin(&this->para);
                                ppAVar8 = std::_List_iterator<Atom_*>::operator*
                                                    ((_List_iterator<Atom_*> *)&temp_1);
                                iVar3 = (*(*ppAVar8)->_vptr_Atom[3])();
                                pDVar9 = (Data *)CONCAT44(extraout_var_02,iVar3);
                                if (pDVar9 == (Data *)0x0) {
                                  local_d8 = 0;
                                }
                                else {
                                  local_d8 = __dynamic_cast(pDVar9,&Data::typeinfo,&Bool::typeinfo,0
                                                           );
                                }
                                if ((*(byte *)(local_d8 + 0xc) & 1) == 0) {
                                  std::_List_iterator<Atom_*>::operator++
                                            ((_List_iterator<Atom_*> *)&temp_1,0);
                                  std::_List_iterator<Atom_*>::operator++
                                            ((_List_iterator<Atom_*> *)&temp_1,0);
                                }
                                else {
                                  std::_List_iterator<Atom_*>::operator++
                                            ((_List_iterator<Atom_*> *)&temp_1,0);
                                }
                                ppAVar8 = std::_List_iterator<Atom_*>::operator*
                                                    ((_List_iterator<Atom_*> *)&temp_1);
                                iVar3 = (*(*ppAVar8)->_vptr_Atom[3])(*ppAVar8,result);
                                local_20 = (Data *)CONCAT44(extraout_var_03,iVar3);
                                Data::check(pDVar9);
                              }
                              else {
                                bVar2 = std::operator==(&this->func,"function");
                                if (bVar2) {
                                  Function::newFunction(&this->para);
                                  local_20 = Data::trueData;
                                }
                                else {
                                  bVar2 = std::operator==(&this->func,"runtime");
                                  if (bVar2) {
                                    Runtime::display((Runtime *)result);
                                    local_20 = Data::trueData;
                                  }
                                  else {
                                    pvVar10 = genParaData(this,(Runtime *)result);
                                    local_20 = Function::call(&this->func,pvVar10);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Runtime::popVarEnv((Runtime *)result);
  return local_20;
}

Assistant:

Data *Bracket::eval(Runtime *runtime) {
    runtime->pushVarEnv();
    Data *result;
    if (func == "+") {
        result = Data::plus(genParaData(runtime));
    } else if (func == "-") {
        result = Data::minus(genParaData(runtime));
    } else if (func == "*") {
        result = Data::times(genParaData(runtime));
    } else if (func == ">") {
        result = Data::bigger(genParaData(runtime));
    } else if (func == "<") {
        result = Data::smaller(genParaData(runtime));
    } else if (func == "/") {
        result = Data::divide(genParaData(runtime));
    } else if (func == "%") {
        result = Data::mod(genParaData(runtime));
    } else if (func == "=") {
        result = Data::equal(genParaData(runtime));
    } else if (func == "set") {
        runtime->setVar(((Symbol *) (*para.begin()))->name,
                        (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "echo") {
        result = (*para.begin())->eval(runtime);
    } else if (func == "assign") {
        runtime->assignVar(((Symbol *) (*para.begin()))->name,
                           (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "begin") {
        auto temp = genParaData(runtime);
        for (auto i = 0; i < temp->size() - 1; i++) {
            Data::check((*temp)[i]);
        }
        result = (*temp)[temp->size()-1];
        delete temp;
    } else if (func == "print") {
        result = Data::print(genParaData(runtime));
    } else if (func == "display") {
        result = Data::display(genParaData(runtime)); 
    } else if (func == "if") {
        auto cursor = para.begin();
        auto temp = (*cursor)->eval(runtime);
        Bool *judge = dynamic_cast<Bool *>(temp);
        if (judge->value) {
            cursor++;
        } else {
            cursor++;
            cursor++;
        }
        result = (*cursor)->eval(runtime);
        Data::check(temp);
    } else if (func == "function") {
        Function::newFunction(&para);
        result = Data::trueData;
    } else if (func == "runtime") {
        runtime->display();
        result = Data::trueData;
    } else {
        result = Function::call(func, genParaData(runtime));
    }
    runtime->popVarEnv();
    return result;
}